

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O1

int load_checkpoint(int idx)

{
  undefined2 uVar1;
  int iVar2;
  nh_option_desc *pnVar3;
  long lVar4;
  char *name;
  int ialign;
  int igend;
  int irace;
  int irole;
  int playmode;
  char namebuf [256];
  int local_14c;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  char local_138 [264];
  
  uVar1 = loginfo._36_2_;
  iVar2 = -1;
  if ((-1 < idx) && (idx < cpcount)) {
    loginfo.out_of_sync = '\0';
    replay_end();
    freedynamicdata();
    replay_begin();
    replay_read_newgame(&turntime,&local_13c,local_138,&local_140,&local_144,&local_148,&local_14c);
    fseek((FILE *)loginfo.flog,(long)checkpoints[(uint)idx].nexttoken,0);
    program_state.restoring = 1;
    loginfo._36_2_ = uVar1;
    startup_common(local_138,local_13c);
    dorecover(&checkpoints[(uint)idx].cpdata);
    checkpoints[(uint)idx].cpdata.pos = 0;
    mfree(&diff_base);
    mnew(&diff_base,(memfile *)0x0);
    iflags.disable_log = '\x01';
    program_state.viewing = 1;
    program_state.game_running = 1;
    pnVar3 = checkpoints[(uint)idx].opt;
    name = pnVar3->name;
    if (name != (char *)0x0) {
      lVar4 = 0x30;
      do {
        nh_set_option(name,pnVar3->value,'\0');
        name = *(char **)((long)&(checkpoints[(uint)idx].opt)->name + lVar4);
        pnVar3 = (nh_option_desc *)((long)&(checkpoints[(uint)idx].opt)->name + lVar4);
        lVar4 = lVar4 + 0x30;
      } while (name != (char *)0x0);
    }
    savegame(&diff_base);
    iVar2 = checkpoints[(uint)idx].actions;
  }
  return iVar2;
}

Assistant:

static int load_checkpoint(int idx)
{
    int playmode, i, irole, irace, igend, ialign;
    boolean cmd_invalid, diff_invalid;
    char namebuf[BUFSZ];
    
    if (idx < 0 || idx >= cpcount)
	return -1;
    
    cmd_invalid = loginfo.cmds_are_invalid;
    diff_invalid = loginfo.diffs_are_invalid;
    loginfo.out_of_sync = FALSE; /* we're destroying saved state anyway */

    replay_end();
    freedynamicdata();

    replay_begin();
    replay_read_newgame(&turntime, &playmode, namebuf,
			&irole, &irace, &igend, &ialign);
    fseek(loginfo.flog, checkpoints[idx].nexttoken, SEEK_SET);

    loginfo.cmds_are_invalid = cmd_invalid;
    loginfo.diffs_are_invalid = diff_invalid;

    program_state.restoring = TRUE;
    startup_common(namebuf, playmode);
    dorecover(&checkpoints[idx].cpdata);
    checkpoints[idx].cpdata.pos = 0;

    mfree(&diff_base);
    mnew(&diff_base, NULL);

    iflags.disable_log = TRUE;
    program_state.viewing = TRUE;
    program_state.game_running = TRUE;
    
    /* restore the full option state of the time of the checkpoint */
    for (i = 0; checkpoints[idx].opt[i].name; i++)
	nh_set_option(checkpoints[idx].opt[i].name, checkpoints[idx].opt[i].value, FALSE);

    savegame(&diff_base);

    return checkpoints[idx].actions;
}